

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRedcostFixing.cpp
# Opt level: O0

vector<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
* __thiscall
HighsRedcostFixing::getLurkingBounds(HighsRedcostFixing *this,HighsMipSolver *mipsolver)

{
  int iVar1;
  bool bVar2;
  pointer pHVar3;
  reference piVar4;
  pointer ppVar5;
  reference pvVar6;
  vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  *in_RSI;
  vector<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
  *in_RDI;
  const_iterator it_1;
  const_iterator it;
  HighsInt col;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
  *domchgs;
  multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
  *in_stack_ffffffffffffff28;
  HighsDomainChange *in_stack_ffffffffffffff30;
  double *in_stack_ffffffffffffff38;
  vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  *in_stack_ffffffffffffff40;
  _Self local_80;
  multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_> local_78;
  vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  local_48;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  vector<int,_std::allocator<int>_> *local_28;
  undefined1 local_19;
  
  local_19 = 0;
  std::
  vector<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
  ::vector((vector<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
            *)0x689796);
  bVar2 = std::
          vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
          ::empty(in_stack_ffffffffffffff40);
  if (!bVar2) {
    pHVar3 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x6897d6);
    local_28 = &pHVar3->integral_cols;
    local_30._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff28);
    local_48.
    super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff28);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_ffffffffffffff30,
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_ffffffffffffff28), bVar2) {
      piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_30);
      local_48.
      super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ = *piVar4;
      std::
      vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
      ::operator[](in_RSI + 1,
                   (long)local_48.
                         super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_);
      local_48.
      super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)std::
                    multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                    ::begin(in_stack_ffffffffffffff28);
      while( true ) {
        std::
        vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
        ::operator[](in_RSI + 1,
                     (long)local_48.
                           super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_4_);
        local_78._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)std::
                     multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                     ::end(in_stack_ffffffffffffff28);
        bVar2 = std::operator!=((_Self *)&local_48,(_Self *)((long)&local_78 + 0x28));
        if (!bVar2) break;
        ppVar5 = std::_Rb_tree_const_iterator<std::pair<const_double,_int>_>::operator->
                           ((_Rb_tree_const_iterator<std::pair<const_double,_int>_> *)
                            in_stack_ffffffffffffff30);
        iVar1 = ppVar5->second;
        pHVar3 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                 operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             *)0x6898d8);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&(pHVar3->domain).col_lower_,
                            (long)local_48.
                                  super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish._4_4_);
        if (*pvVar6 <= (double)iVar1 && (double)iVar1 != *pvVar6) {
          in_stack_ffffffffffffff40 = &local_48;
          std::_Rb_tree_const_iterator<std::pair<const_double,_int>_>::operator->
                    ((_Rb_tree_const_iterator<std::pair<const_double,_int>_> *)
                     in_stack_ffffffffffffff30);
          ppVar5 = std::_Rb_tree_const_iterator<std::pair<const_double,_int>_>::operator->
                             ((_Rb_tree_const_iterator<std::pair<const_double,_int>_> *)
                              in_stack_ffffffffffffff30);
          local_78._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)(double)ppVar5->second;
          local_78._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ =
               local_48.
               super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish._4_4_;
          local_78._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ = 0;
          std::
          vector<std::pair<double,HighsDomainChange>,std::allocator<std::pair<double,HighsDomainChange>>>
          ::emplace_back<double_const&,HighsDomainChange>
                    ((vector<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
                      *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                     in_stack_ffffffffffffff30);
        }
        std::_Rb_tree_const_iterator<std::pair<const_double,_int>_>::operator++
                  ((_Rb_tree_const_iterator<std::pair<const_double,_int>_> *)
                   in_stack_ffffffffffffff30);
      }
      std::
      vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
      ::operator[](in_RSI,(long)local_48.
                                super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish._4_4_);
      local_78._M_t._M_impl._0_8_ =
           std::
           multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
           ::begin(in_stack_ffffffffffffff28);
      while( true ) {
        std::
        vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
        ::operator[](in_RSI,(long)local_48.
                                  super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish._4_4_);
        local_80._M_node =
             (_Base_ptr)
             std::
             multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
             ::end(in_stack_ffffffffffffff28);
        bVar2 = std::operator!=((_Self *)&local_78,&local_80);
        if (!bVar2) break;
        ppVar5 = std::_Rb_tree_const_iterator<std::pair<const_double,_int>_>::operator->
                           ((_Rb_tree_const_iterator<std::pair<const_double,_int>_> *)
                            in_stack_ffffffffffffff30);
        in_stack_ffffffffffffff38 = (double *)(double)ppVar5->second;
        pHVar3 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                 operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             *)0x689a0f);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&(pHVar3->domain).col_upper_,
                            (long)local_48.
                                  super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish._4_4_);
        if ((double)in_stack_ffffffffffffff38 < *pvVar6) {
          in_stack_ffffffffffffff28 = &local_78;
          in_stack_ffffffffffffff30 =
               (HighsDomainChange *)
               std::_Rb_tree_const_iterator<std::pair<const_double,_int>_>::operator->
                         ((_Rb_tree_const_iterator<std::pair<const_double,_int>_> *)
                          in_stack_ffffffffffffff30);
          std::_Rb_tree_const_iterator<std::pair<const_double,_int>_>::operator->
                    ((_Rb_tree_const_iterator<std::pair<const_double,_int>_> *)
                     in_stack_ffffffffffffff30);
          std::
          vector<std::pair<double,HighsDomainChange>,std::allocator<std::pair<double,HighsDomainChange>>>
          ::emplace_back<double_const&,HighsDomainChange>
                    ((vector<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
                      *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                     in_stack_ffffffffffffff30);
        }
        std::_Rb_tree_const_iterator<std::pair<const_double,_int>_>::operator++
                  ((_Rb_tree_const_iterator<std::pair<const_double,_int>_> *)
                   in_stack_ffffffffffffff30);
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_30);
    }
  }
  return in_RDI;
}

Assistant:

std::vector<std::pair<double, HighsDomainChange>>
HighsRedcostFixing::getLurkingBounds(const HighsMipSolver& mipsolver) const {
  std::vector<std::pair<double, HighsDomainChange>> domchgs;
  if (lurkingColLower.empty()) return domchgs;

  for (HighsInt col : mipsolver.mipdata_->integral_cols) {
    for (auto it = lurkingColLower[col].begin();
         it != lurkingColLower[col].end(); ++it) {
      if (it->second > mipsolver.mipdata_->domain.col_lower_[col])
        domchgs.emplace_back(
            it->first,
            HighsDomainChange{(double)it->second, col, HighsBoundType::kLower});
    }

    for (auto it = lurkingColUpper[col].begin();
         it != lurkingColUpper[col].end(); ++it) {
      if (it->second < mipsolver.mipdata_->domain.col_upper_[col])
        domchgs.emplace_back(
            it->first,
            HighsDomainChange{(double)it->second, col, HighsBoundType::kUpper});
    }
  }

  return domchgs;
}